

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O3

int Sfm_DecMffcArea(Abc_Ntk_t *pNtk,Vec_Int_t *vMffc)

{
  int iVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  double dVar6;
  
  iVar3 = vMffc->nSize;
  if (iVar3 < 1) {
    iVar4 = 0;
  }
  else {
    lVar5 = 0;
    iVar4 = 0;
    do {
      iVar1 = vMffc->pArray[lVar5];
      if (((long)iVar1 < 0) || (pNtk->vObjs->nSize <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar2 = pNtk->vObjs->pArray[iVar1];
      if (pvVar2 != (void *)0x0) {
        dVar6 = Mio_GateReadArea(*(Mio_Gate_t **)((long)pvVar2 + 0x38));
        iVar4 = iVar4 + (int)((float)dVar6 * 1000.0);
        iVar3 = vMffc->nSize;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < iVar3);
  }
  return iVar4;
}

Assistant:

int Sfm_DecMffcArea( Abc_Ntk_t * pNtk, Vec_Int_t * vMffc )
{
    Abc_Obj_t * pObj; 
    int i, nAreaMffc = 0;
    Abc_NtkForEachObjVec( vMffc, pNtk, pObj, i )
        nAreaMffc += Scl_Flt2Int(Mio_GateReadArea((Mio_Gate_t *)pObj->pData));
    return nAreaMffc;
}